

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void PBKDF2_SHA256(uint8_t *passwd,size_t passwdlen,uint8_t *salt,size_t saltlen,uint64_t c,
                  uint8_t *buf,size_t dkLen)

{
  uint uVar1;
  ulong __n;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t ivec [4];
  uint8_t T [32];
  uint8_t U [32];
  HMAC_SHA256_CTX_Y local_1d0;
  HMAC_SHA256_CTX_Y hctx;
  
  HMAC_SHA256_Init_Y(&local_1d0,passwd,passwdlen);
  SHA256_Update_Y(&local_1d0.ictx,salt,saltlen);
  lVar3 = 0;
  while( true ) {
    uVar4 = lVar3 * 0x20;
    __n = dkLen + lVar3 * -0x20;
    if (dkLen < uVar4 || __n == 0) break;
    lVar3 = lVar3 + 1;
    uVar1 = (uint)lVar3;
    ivec = (uint8_t  [4])
           (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    memcpy(&hctx,&local_1d0,0xd0);
    SHA256_Update_Y(&hctx.ictx,ivec,4);
    HMAC_SHA256_Final_Y(U,&hctx);
    T[0x10] = U[0x10];
    T[0x11] = U[0x11];
    T[0x12] = U[0x12];
    T[0x13] = U[0x13];
    T[0x14] = U[0x14];
    T[0x15] = U[0x15];
    T[0x16] = U[0x16];
    T[0x17] = U[0x17];
    T[0x18] = U[0x18];
    T[0x19] = U[0x19];
    T[0x1a] = U[0x1a];
    T[0x1b] = U[0x1b];
    T[0x1c] = U[0x1c];
    T[0x1d] = U[0x1d];
    T[0x1e] = U[0x1e];
    T[0x1f] = U[0x1f];
    T[0] = U[0];
    T[1] = U[1];
    T[2] = U[2];
    T[3] = U[3];
    T[4] = U[4];
    T[5] = U[5];
    T[6] = U[6];
    T[7] = U[7];
    T[8] = U[8];
    T[9] = U[9];
    T[10] = U[10];
    T[0xb] = U[0xb];
    T[0xc] = U[0xc];
    T[0xd] = U[0xd];
    T[0xe] = U[0xe];
    T[0xf] = U[0xf];
    for (uVar5 = 2; uVar5 <= c; uVar5 = uVar5 + 1) {
      HMAC_SHA256_Init_Y(&hctx,passwd,passwdlen);
      SHA256_Update_Y(&hctx.ictx,U,0x20);
      HMAC_SHA256_Final_Y(U,&hctx);
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
        T[lVar2] = T[lVar2] ^ U[lVar2];
      }
    }
    if (0x1f < __n) {
      __n = 0x20;
    }
    memcpy(buf + uVar4,T,__n);
  }
  return;
}

Assistant:

void
PBKDF2_SHA256(const uint8_t * passwd, size_t passwdlen, const uint8_t * salt,
    size_t saltlen, uint64_t c, uint8_t * buf, size_t dkLen)
{
	HMAC_SHA256_CTX_Y PShctx, hctx;
	size_t i;
	uint8_t ivec[4];
	uint8_t U[32];
	uint8_t T[32];
	uint64_t j;
	int k;
	size_t clen;

	/* Compute HMAC state after processing P and S. */
	HMAC_SHA256_Init_Y(&PShctx, passwd, passwdlen);
	HMAC_SHA256_Update_Y(&PShctx, salt, saltlen);

	/* Iterate through the blocks. */
	for (i = 0; i * 32 < dkLen; i++) {
		/* Generate INT(i + 1). */
		be32enc(ivec, (uint32_t)(i + 1));

		/* Compute U_1 = PRF(P, S || INT(i)). */
		memcpy(&hctx, &PShctx, sizeof(HMAC_SHA256_CTX_Y));
		HMAC_SHA256_Update_Y(&hctx, ivec, 4);
		HMAC_SHA256_Final_Y(U, &hctx);

		/* T_i = U_1 ... */
		memcpy(T, U, 32);

		for (j = 2; j <= c; j++) {
			/* Compute U_j. */
			HMAC_SHA256_Init_Y(&hctx, passwd, passwdlen);
			HMAC_SHA256_Update_Y(&hctx, U, 32);
			HMAC_SHA256_Final_Y(U, &hctx);

			/* ... xor U_j ... */
			for (k = 0; k < 32; k++)
				T[k] ^= U[k];
		}

		/* Copy as many bytes as necessary into buf. */
		clen = dkLen - i * 32;
		if (clen > 32)
			clen = 32;
		memcpy(&buf[i * 32], T, clen);
	}

	/* Clean PShctx, since we never called _Final on it. */
	memset(&PShctx, 0, sizeof(HMAC_SHA256_CTX_Y));
}